

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O2

bool asio_service_test::test_read_empty_meta
               (atomic<unsigned_long> *count,meta_cb_params *params,string *meta)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  ostream *poVar4;
  hash<std::thread::id> local_79;
  string _v;
  string _ev;
  id local_38;
  string local_30 [32];
  
  std::mutex::lock(&test_read_empty_meta::lock);
  _ev._M_dataplus._M_p = (pointer)&_ev.field_2;
  _ev._M_string_length = 0;
  _ev.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&_v,(string *)meta);
  bVar3 = std::operator!=(&_ev,&_v);
  if (bVar3) {
    poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<(poVar4,"        time: ");
    poVar4 = std::operator<<(poVar4,"\x1b[1;30m");
    TestSuite::getTimeString_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_30);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"      thread: ");
    poVar4 = std::operator<<(poVar4,"\x1b[33m");
    lVar1 = *(long *)poVar4;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar4 + lVar2 + 0x18) = *(uint *)(poVar4 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar4 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
    poVar4 = std::operator<<(poVar4,0x30);
    local_38._M_thread = pthread_self();
    std::hash<std::thread::id>::operator()(&local_79,&local_38);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          in: ");
    poVar4 = std::operator<<(poVar4,"\x1b[36m");
    poVar4 = std::operator<<(poVar4,"test_read_empty_meta");
    poVar4 = std::operator<<(poVar4,"()\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"          at: ");
    poVar4 = std::operator<<(poVar4,"\x1b[32m");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
                            );
    poVar4 = std::operator<<(poVar4,"\x1b[0m:");
    poVar4 = std::operator<<(poVar4,"\x1b[1;35m");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x210);
    poVar4 = std::operator<<(poVar4,"\x1b[0m");
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"    value of: \x1b[1;34mmeta\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"    expected: \x1b[1;32m");
    poVar4 = std::operator<<(poVar4,(string *)&_ev);
    poVar4 = std::operator<<(poVar4,"\x1b[0m\n");
    poVar4 = std::operator<<(poVar4,"      actual: \x1b[1;31m");
    poVar4 = std::operator<<(poVar4,(string *)&_v);
    std::operator<<(poVar4,"\x1b[0m\n");
    std::__cxx11::string::~string(local_30);
    TestSuite::failHandler();
    std::__cxx11::string::~string((string *)&_v);
    std::__cxx11::string::~string((string *)&_ev);
  }
  else {
    std::__cxx11::string::~string((string *)&_v);
    std::__cxx11::string::~string((string *)&_ev);
    if (count != (atomic<unsigned_long> *)0x0) {
      LOCK();
      (count->super___atomic_base<unsigned_long>)._M_i =
           (count->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&test_read_empty_meta::lock);
  return true;
}

Assistant:

bool test_read_empty_meta( std::atomic<size_t>* count,
                           const asio_service::meta_cb_params& params,
                           const std::string& meta )
{
    static std::mutex lock;
    std::lock_guard<std::mutex> l(lock);

    CHK_EQ( std::string(), meta );

    if (count) (*count)++;
    return true;
}